

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void test_to_number<int>(char *str,int wanted,bool error,_func_int_char_ptr *fn)

{
  ostream *poVar1;
  void *pvVar2;
  runtime_error *e;
  string local_48 [8];
  string msg;
  int result;
  bool worked;
  bool threw;
  _func_int_char_ptr *fn_local;
  bool error_local;
  int wanted_local;
  char *str_local;
  
  msg.field_2._M_local_buf[0xf] = '\0';
  msg.field_2._M_local_buf[0xe] = '\0';
  msg.field_2._8_4_ = 0;
  std::__cxx11::string::string(local_48);
  msg.field_2._8_4_ = (*fn)(str);
  msg.field_2._M_local_buf[0xe] = wanted == msg.field_2._8_4_;
  if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
    if ((bool)msg.field_2._M_local_buf[0xe]) {
      poVar1 = std::operator<<((ostream *)&std::cout,str);
      poVar1 = std::operator<<(poVar1," to int: PASSED");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,str);
      poVar1 = std::operator<<(poVar1," to int failed; got ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,msg.field_2._8_4_);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else if (error) {
    poVar1 = std::operator<<((ostream *)&std::cout,str);
    poVar1 = std::operator<<(poVar1," to int threw (");
    poVar1 = std::operator<<(poVar1,local_48);
    poVar1 = std::operator<<(poVar1,"): PASSED");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,str);
    poVar1 = std::operator<<(poVar1," to int threw but wanted ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,wanted);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
test_to_number(char const* str, int_T wanted, bool error, int_T (*fn)(char const*))
{
    bool threw = false;
    bool worked = false;
    int_T result = 0;
    std::string msg;
    try {
        result = fn(str);
        worked = (wanted == result);
    } catch (std::runtime_error const& e) {
        threw = true;
        msg = e.what();
    }
    if (threw) {
        if (error) {
            std::cout << str << " to int threw (" << msg << "): PASSED" << std::endl;
        } else {
            std::cout << str << " to int threw but wanted " << wanted << std::endl;
        }
    } else {
        if (worked) {
            std::cout << str << " to int: PASSED" << std::endl;
        } else {
            std::cout << str << " to int failed; got " << result << std::endl;
        }
    }
}